

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O3

Edge * __thiscall
btConvexHullInternal::Pool<btConvexHullInternal::Edge>::newObject
          (Pool<btConvexHullInternal::Edge> *this)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  PoolArray<btConvexHullInternal::Edge> *pPVar4;
  Edge *pEVar5;
  long lVar6;
  Edge *pEVar7;
  ulong uVar8;
  Edge *pEVar9;
  undefined1 auVar10 [16];
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  
  pEVar5 = this->freeObjects;
  if (pEVar5 == (Edge *)0x0) {
    pPVar4 = this->nextArray;
    if (pPVar4 == (PoolArray<btConvexHullInternal::Edge> *)0x0) {
      pPVar4 = (PoolArray<btConvexHullInternal::Edge> *)btAlignedAllocInternal(0x18,0x10);
      iVar1 = this->arraySize;
      pPVar4->size = iVar1;
      pPVar4->next = (PoolArray<btConvexHullInternal::Edge> *)0x0;
      pEVar5 = (Edge *)btAlignedAllocInternal((long)iVar1 * 0x30,0x10);
      pPVar4->array = pEVar5;
      pPVar4->next = this->arrays;
      this->arrays = pPVar4;
    }
    else {
      this->nextArray = pPVar4->next;
      pEVar5 = pPVar4->array;
    }
    auVar3 = _DAT_001ee5d0;
    auVar2 = _DAT_001ee270;
    iVar1 = pPVar4->size;
    if (0 < (long)iVar1) {
      lVar6 = (long)iVar1 + -1;
      auVar10._8_4_ = (int)lVar6;
      auVar10._0_8_ = lVar6;
      auVar10._12_4_ = (int)((ulong)lVar6 >> 0x20);
      pEVar7 = pEVar5 + 1;
      iVar11 = 0;
      iVar12 = 1;
      auVar10 = auVar10 ^ _DAT_001ee270;
      uVar8 = 0;
      do {
        auVar13._8_4_ = (int)uVar8;
        auVar13._0_8_ = uVar8;
        auVar13._12_4_ = (int)(uVar8 >> 0x20);
        auVar13 = (auVar13 | auVar3) ^ auVar2;
        if ((bool)(~(auVar13._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar13._0_4_ ||
                    auVar10._4_4_ < auVar13._4_4_) & 1)) {
          pEVar9 = (Edge *)0x0;
          if (iVar11 + 1 < iVar1) {
            pEVar9 = pEVar7;
          }
          pEVar7[-1].next = pEVar9;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          pEVar9 = pEVar7 + 1;
          if (iVar1 <= iVar12 + 1) {
            pEVar9 = (Edge *)0x0;
          }
          pEVar7->next = pEVar9;
        }
        uVar8 = uVar8 + 2;
        iVar11 = iVar11 + 2;
        iVar12 = iVar12 + 2;
        pEVar7 = pEVar7 + 2;
      } while ((iVar1 + 1U & 0xfffffffe) != uVar8);
    }
  }
  this->freeObjects = pEVar5->next;
  pEVar5->face = (Face *)0x0;
  pEVar5->copy = 0;
  *(undefined4 *)&pEVar5->field_0x2c = 0;
  pEVar5->reverse = (Edge *)0x0;
  pEVar5->target = (Vertex *)0x0;
  pEVar5->next = (Edge *)0x0;
  pEVar5->prev = (Edge *)0x0;
  return pEVar5;
}

Assistant:

T* newObject()
				{
					T* o = freeObjects;
					if (!o)
					{
						PoolArray<T>* p = nextArray;
						if (p)
						{
							nextArray = p->next;
						}
						else
						{
							p = new(btAlignedAlloc(sizeof(PoolArray<T>), 16)) PoolArray<T>(arraySize);
							p->next = arrays;
							arrays = p;
						}
						o = p->init();
					}
					freeObjects = o->next;
					return new(o) T();
				}